

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_invalidModelElement_Test::~Parser_invalidModelElement_Test
          (Parser_invalidModelElement_Test *this)

{
  Parser_invalidModelElement_Test *this_local;
  
  ~Parser_invalidModelElement_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, invalidModelElement)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <uknits/>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues = {
        "Model 'model_name' has an invalid child element 'uknits'.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
    EXPECT_EQ_ISSUES(expectedIssues, p);
}